

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

void Fxu_HeapDoubleInsert(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  int iVar1;
  Fxu_Double *pDiv_local;
  Fxu_HeapDouble *p_local;
  
  if (p->nItems == p->nItemsAlloc) {
    Fxu_HeapDoubleResize(p);
  }
  iVar1 = p->nItems + 1;
  p->nItems = iVar1;
  p->pTree[iVar1] = pDiv;
  pDiv->HNum = p->nItems;
  Fxu_HeapDoubleMoveUp(p,pDiv);
  return;
}

Assistant:

void Fxu_HeapDoubleInsert( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    if ( p->nItems == p->nItemsAlloc )
        Fxu_HeapDoubleResize( p );
    // put the last entry to the last place and move up
    p->pTree[++p->nItems] = pDiv;
    pDiv->HNum = p->nItems;
    // move the last entry up if necessary
    Fxu_HeapDoubleMoveUp( p, pDiv );
}